

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerCore.cc
# Opt level: O0

void __thiscall PowerCore::unimplemented(PowerCore *this,char *name,uint32_t addr)

{
  uint uVar1;
  ostream *poVar2;
  uint32_t insn;
  uint32_t addr_local;
  char *name_local;
  PowerCore *this_local;
  
  uVar1 = load<unsigned_int>(this,addr);
  poVar2 = std::operator<<((ostream *)&std::cerr,"Unimplemented instruction ");
  poVar2 = std::operator<<(poVar2,name);
  poVar2 = std::operator<<(poVar2," at ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::hex);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,addr);
  poVar2 = std::operator<<(poVar2,": ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::hex);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

void PowerCore::unimplemented(const char* name, uint32_t addr)
{
    uint32_t insn = load<uint32_t>(addr);
    std::cerr << "Unimplemented instruction " << name << " at " << std::hex << addr
                << ": " << std::hex << insn << std::endl << std::flush;
    exit(1);
}